

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O0

void tlx::die_with_message(char *msg,char *file,size_t line)

{
  ostream *poVar1;
  string local_1c8;
  ostringstream local_198 [8];
  ostringstream oss;
  size_t line_local;
  char *file_local;
  char *msg_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,msg);
  poVar1 = std::operator<<(poVar1," @ ");
  poVar1 = std::operator<<(poVar1,file);
  poVar1 = std::operator<<(poVar1,':');
  std::ostream::operator<<(poVar1,line);
  std::__cxx11::ostringstream::str();
  die_with_message(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void die_with_message(const char* msg, const char* file, size_t line) {
    std::ostringstream oss;
    oss << msg << " @ " << file << ':' << line;
    die_with_message(oss.str());
}